

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_test.cc
# Opt level: O3

void __thiscall DebugTest_CanBeChained_Test::TestBody(DebugTest_CanBeChained_Test *this)

{
  ostringstream *poVar1;
  string *__lhs;
  int iVar2;
  pointer pcVar3;
  bool bVar4;
  char *message;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  internal local_78 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38 [2];
  
  iVar2 = (this->super_DebugTest).max_debug_level;
  poVar1 = &(this->super_DebugTest).oss;
  pcVar3 = (this->super_DebugTest).str._M_dataplus._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar3,pcVar3 + (this->super_DebugTest).str._M_string_length);
  if (iVar2 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)local_48,local_40);
  }
  pcVar3 = (this->super_DebugTest).str._M_dataplus._M_p;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (this->super_DebugTest).str._M_string_length);
  if (iVar2 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)local_68,local_60);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  __lhs = &(this->super_DebugTest).str;
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  std::operator+(&local_b8,__lhs,__lhs);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_78,"str + str","oss.str()",&local_b8,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_70.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/debug_test.cc"
               ,0x12,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_b8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(DebugTest, CanBeChained) {
  Debug(max_debug_level, oss) << str << str;
  EXPECT_EQ(str + str, oss.str());
}